

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_alloc.c
# Opt level: O0

string_t * new_string_pool(string_alloc_t *a_str)

{
  string_t *psVar1;
  char *pcVar2;
  string_t *str;
  string_alloc_t *a_str_local;
  
  psVar1 = (string_t *)realloc(a_str->strings,(a_str->nstrings + 1) * 0x10);
  if (psVar1 == (string_t *)0x0) {
    a_str_local = (string_alloc_t *)0x0;
  }
  else {
    a_str->strings = psVar1;
    a_str_local = (string_alloc_t *)(a_str->strings + a_str->nstrings);
    pcVar2 = (char *)malloc(a_str->max_length);
    a_str_local->max_length = (size_t)pcVar2;
    if ((char *)a_str_local->max_length == (char *)0x0) {
      a_str_local = (string_alloc_t *)0x0;
    }
    else {
      a_str_local->nstrings = 0;
      a_str->nstrings = a_str->nstrings + 1;
    }
  }
  return (string_t *)a_str_local;
}

Assistant:

static string_t *new_string_pool(string_alloc_t *a_str) {
    string_t *str;
    
    str = realloc(a_str->strings, (a_str->nstrings + 1) * sizeof(*a_str->strings));
    
    if (NULL == str) return NULL;
    
    a_str->strings = str;
    str = &a_str->strings[a_str->nstrings];
    
    str->str = malloc(a_str->max_length);;
    
    if (NULL == str->str) return NULL;
    
    str->used = 0;
    a_str->nstrings++;
    
    return str;
}